

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O3

HullError __thiscall
HullLibrary::CreateConvexHull(HullLibrary *this,HullDesc *desc,HullResult *result)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  cbtVector3 *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  cbtVector3 *pcVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  HullError HVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  uint ovcount;
  PHullResult hr;
  cbtAlignedObjectArray<cbtVector3> vertexScratch;
  cbtAlignedObjectArray<cbtVector3> vertexSource;
  cbtVector3 scale;
  uint local_bc;
  PHullResult local_b8;
  cbtAlignedObjectArray<cbtVector3> local_80;
  cbtAlignedObjectArray<cbtVector3> local_60;
  cbtVector3 local_40;
  
  local_b8.m_Indices.m_ownsMemory = true;
  local_b8.m_Indices.m_data = (uint *)0x0;
  local_b8.m_Indices.m_size = 0;
  local_b8.m_Indices.m_capacity = 0;
  local_b8.mVcount = 0;
  local_b8.mIndexCount = 0;
  local_b8.mFaceCount = 0;
  local_b8.mVertices = (cbtVector3 *)0x0;
  local_60.m_ownsMemory = true;
  local_60.m_data = (cbtVector3 *)0x0;
  local_60.m_size = 0;
  local_60.m_capacity = 0;
  uVar16 = 8;
  if (8 < desc->mVcount) {
    uVar16 = (ulong)desc->mVcount;
  }
  pcVar8 = (cbtVector3 *)cbtAlignedAllocInternal(uVar16 << 4,0x10);
  if ((long)local_60.m_size < 1) {
    if (local_60.m_data != (cbtVector3 *)0x0) goto LAB_008ec7b5;
  }
  else {
    lVar12 = 0;
    do {
      puVar1 = (undefined8 *)((long)(local_60.m_data)->m_floats + lVar12);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)pcVar8->m_floats + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar12 = lVar12 + 0x10;
    } while ((long)local_60.m_size * 0x10 != lVar12);
LAB_008ec7b5:
    if (local_60.m_ownsMemory == true) {
      cbtAlignedFreeInternal(local_60.m_data);
    }
  }
  local_60.m_ownsMemory = true;
  local_60.m_capacity = (int)uVar16;
  local_60.m_size = (int)uVar16;
  local_60.m_data = pcVar8;
  bVar5 = CleanupVertices(this,desc->mVcount,desc->mVertices,desc->mVertexStride,&local_bc,pcVar8,
                          desc->mNormalEpsilon,&local_40);
  HVar15 = QE_FAIL;
  if (!bVar5) goto LAB_008ecce4;
  if (local_bc != 0) {
    uVar11 = 0;
    do {
      uVar6 = uVar11 + 1;
      auVar17._0_4_ =
           local_40.m_floats[0] * (float)*(undefined8 *)local_60.m_data[(int)uVar11].m_floats;
      auVar17._4_4_ =
           local_40.m_floats[1] *
           (float)((ulong)*(undefined8 *)local_60.m_data[(int)uVar11].m_floats >> 0x20);
      auVar17._8_8_ = 0;
      uVar3 = vmovlps_avx(auVar17);
      *(undefined8 *)local_60.m_data[(int)uVar11].m_floats = uVar3;
      local_60.m_data[(int)uVar11].m_floats[2] =
           local_40.m_floats[2] * local_60.m_data[(int)uVar11].m_floats[2];
      uVar11 = uVar6;
    } while (local_bc != uVar6);
  }
  bVar5 = ComputeHull(this,local_bc,local_60.m_data,&local_b8,desc->mMaxVertices);
  if (!bVar5) goto LAB_008ecce4;
  uVar11 = local_b8.mVcount;
  local_80.m_ownsMemory = true;
  local_80.m_data = (cbtVector3 *)0x0;
  local_80.m_size = 0;
  local_80.m_capacity = 0;
  pcVar8 = (cbtVector3 *)cbtAlignedAllocInternal((local_b8._0_8_ & 0xffffffff) << 4,0x10);
  if ((long)local_80.m_size < 1) {
    if (local_80.m_data != (cbtVector3 *)0x0) goto LAB_008ec8d1;
  }
  else {
    lVar12 = 0;
    do {
      puVar1 = (undefined8 *)((long)(local_80.m_data)->m_floats + lVar12);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)pcVar8->m_floats + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar12 = lVar12 + 0x10;
    } while ((long)local_80.m_size * 0x10 != lVar12);
LAB_008ec8d1:
    if (local_80.m_ownsMemory == true) {
      cbtAlignedFreeInternal(local_80.m_data);
    }
  }
  local_80.m_ownsMemory = true;
  local_80.m_capacity = uVar11;
  local_80.m_size = uVar11;
  local_80.m_data = pcVar8;
  BringOutYourDead(this,local_b8.mVertices,local_b8.mVcount,pcVar8,&local_bc,
                   local_b8.m_Indices.m_data,local_b8.mIndexCount);
  if ((desc->mFlags & 1) == 0) {
    result->mPolygons = true;
    result->mNumOutputVertices = local_bc;
    uVar11 = (result->m_OutputVertices).m_size;
    if (((int)uVar11 < (int)local_bc) && ((result->m_OutputVertices).m_capacity < (int)local_bc)) {
      if (local_bc == 0) {
        pcVar8 = (cbtVector3 *)0x0;
      }
      else {
        pcVar8 = (cbtVector3 *)cbtAlignedAllocInternal((long)(int)local_bc << 4,0x10);
        uVar11 = (result->m_OutputVertices).m_size;
      }
      if (0 < (int)uVar11) {
        lVar12 = 0;
        do {
          puVar1 = (undefined8 *)((long)((result->m_OutputVertices).m_data)->m_floats + lVar12);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar8->m_floats + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)uVar11 << 4 != lVar12);
      }
      pcVar4 = (result->m_OutputVertices).m_data;
      if ((pcVar4 != (cbtVector3 *)0x0) && ((result->m_OutputVertices).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(pcVar4);
      }
      (result->m_OutputVertices).m_ownsMemory = true;
      (result->m_OutputVertices).m_data = pcVar8;
      (result->m_OutputVertices).m_capacity = local_bc;
    }
    (result->m_OutputVertices).m_size = local_bc;
    result->mNumFaces = local_b8.mFaceCount;
    uVar6 = local_b8.mIndexCount + local_b8.mFaceCount;
    result->mNumIndices = uVar6;
    uVar11 = (result->m_Indices).m_size;
    if ((int)uVar11 < (int)uVar6) {
      if ((result->m_Indices).m_capacity < (int)uVar6) {
        if (uVar6 == 0) {
          puVar9 = (uint *)0x0;
          uVar7 = uVar11;
        }
        else {
          puVar9 = (uint *)cbtAlignedAllocInternal((long)(int)uVar6 * 4,0x10);
          uVar7 = (result->m_Indices).m_size;
        }
        puVar13 = (result->m_Indices).m_data;
        if ((int)uVar7 < 1) {
          if (puVar13 != (uint *)0x0) goto LAB_008ecb45;
        }
        else {
          uVar16 = 0;
          do {
            puVar9[uVar16] = puVar13[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar7 != uVar16);
LAB_008ecb45:
          if ((result->m_Indices).m_ownsMemory == true) {
            cbtAlignedFreeInternal(puVar13);
          }
        }
        (result->m_Indices).m_ownsMemory = true;
        (result->m_Indices).m_data = puVar9;
        (result->m_Indices).m_capacity = uVar6;
      }
      else {
        puVar9 = (result->m_Indices).m_data;
      }
      memset(puVar9 + (int)uVar11,0,((long)(int)uVar6 - (long)(int)uVar11) * 4);
    }
    uVar11 = local_b8.mFaceCount;
    (result->m_Indices).m_size = uVar6;
    memcpy((result->m_OutputVertices).m_data,local_80.m_data,(ulong)local_bc << 4);
    puVar9 = local_b8.m_Indices.m_data;
    if (uVar11 != 0) {
      uVar11 = 0;
      puVar10 = (result->m_Indices).m_data + 2;
      puVar13 = local_b8.m_Indices.m_data;
      do {
        puVar10[-2] = 3;
        if ((desc->mFlags & 2) == 0) {
          puVar10[-1] = *puVar13;
          *puVar10 = puVar13[1];
          puVar14 = puVar13 + 2;
        }
        else {
          puVar10[-1] = puVar13[2];
          *puVar10 = puVar13[1];
          puVar14 = puVar13;
        }
        puVar13 = puVar13 + 3;
        uVar11 = uVar11 + 1;
        puVar10[1] = *puVar14;
        puVar10 = puVar10 + 4;
      } while (uVar11 < local_b8.mFaceCount);
    }
  }
  else {
    result->mPolygons = false;
    result->mNumOutputVertices = local_bc;
    uVar11 = (result->m_OutputVertices).m_size;
    if (((int)uVar11 < (int)local_bc) && ((result->m_OutputVertices).m_capacity < (int)local_bc)) {
      if (local_bc == 0) {
        pcVar8 = (cbtVector3 *)0x0;
      }
      else {
        pcVar8 = (cbtVector3 *)cbtAlignedAllocInternal((long)(int)local_bc << 4,0x10);
        uVar11 = (result->m_OutputVertices).m_size;
      }
      if (0 < (int)uVar11) {
        lVar12 = 0;
        do {
          puVar1 = (undefined8 *)((long)((result->m_OutputVertices).m_data)->m_floats + lVar12);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar8->m_floats + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)uVar11 << 4 != lVar12);
      }
      pcVar4 = (result->m_OutputVertices).m_data;
      if ((pcVar4 != (cbtVector3 *)0x0) && ((result->m_OutputVertices).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(pcVar4);
      }
      (result->m_OutputVertices).m_ownsMemory = true;
      (result->m_OutputVertices).m_data = pcVar8;
      (result->m_OutputVertices).m_capacity = local_bc;
    }
    (result->m_OutputVertices).m_size = local_bc;
    result->mNumFaces = local_b8.mFaceCount;
    uVar6 = local_b8.mIndexCount;
    result->mNumIndices = local_b8.mIndexCount;
    uVar11 = (result->m_Indices).m_size;
    if ((int)uVar11 < (int)local_b8.mIndexCount) {
      lVar12 = (long)(int)local_b8.mIndexCount;
      if ((result->m_Indices).m_capacity < (int)local_b8.mIndexCount) {
        if (local_b8.mIndexCount == 0) {
          puVar9 = (uint *)0x0;
          uVar7 = uVar11;
        }
        else {
          puVar9 = (uint *)cbtAlignedAllocInternal(lVar12 * 4,0x10);
          uVar7 = (result->m_Indices).m_size;
        }
        puVar13 = (result->m_Indices).m_data;
        if ((int)uVar7 < 1) {
          if (puVar13 != (uint *)0x0) goto LAB_008ecbfb;
        }
        else {
          uVar16 = 0;
          do {
            puVar9[uVar16] = puVar13[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar7 != uVar16);
LAB_008ecbfb:
          if ((result->m_Indices).m_ownsMemory == true) {
            cbtAlignedFreeInternal(puVar13);
          }
        }
        (result->m_Indices).m_ownsMemory = true;
        (result->m_Indices).m_data = puVar9;
        (result->m_Indices).m_capacity = uVar6;
      }
      else {
        puVar9 = (result->m_Indices).m_data;
      }
      memset(puVar9 + (int)uVar11,0,(lVar12 - (int)uVar11) * 4);
    }
    (result->m_Indices).m_size = uVar6;
    memcpy((result->m_OutputVertices).m_data,local_80.m_data,(ulong)local_bc << 4);
    puVar9 = local_b8.m_Indices.m_data;
    if ((desc->mFlags & 2) == 0) {
      memcpy((result->m_Indices).m_data,local_b8.m_Indices.m_data,
             ((ulong)local_b8._0_8_ >> 0x20) << 2);
    }
    else if (local_b8.mFaceCount != 0) {
      puVar13 = (result->m_Indices).m_data;
      lVar12 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 + 1;
        *(undefined4 *)((long)puVar13 + lVar12) =
             *(undefined4 *)((long)local_b8.m_Indices.m_data + lVar12 + 8);
        *(undefined4 *)((long)puVar13 + lVar12 + 4) =
             *(undefined4 *)((long)local_b8.m_Indices.m_data + lVar12 + 4);
        *(undefined4 *)((long)puVar13 + lVar12 + 8) =
             *(undefined4 *)((long)local_b8.m_Indices.m_data + lVar12);
        lVar12 = lVar12 + 0xc;
      } while (uVar11 < local_b8.mFaceCount);
    }
  }
  if (local_b8.m_Indices.m_size != 0) {
    if ((puVar9 != (uint *)0x0) && (local_b8.m_Indices.m_ownsMemory == true)) {
      cbtAlignedFreeInternal(puVar9);
    }
    local_b8.m_Indices.m_ownsMemory = true;
    local_b8.m_Indices.m_data = (uint *)0x0;
    local_b8.m_Indices.m_size = 0;
    local_b8.m_Indices.m_capacity = 0;
  }
  HVar15 = QE_OK;
  local_b8.mVcount = 0;
  local_b8.mIndexCount = 0;
  local_b8.mVertices = (cbtVector3 *)0x0;
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_80);
LAB_008ecce4:
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_60);
  cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&local_b8.m_Indices);
  return HVar15;
}

Assistant:

HullError HullLibrary::CreateConvexHull(const HullDesc &desc,  // describes the input request
										HullResult &result)    // contains the resulst
{
	HullError ret = QE_FAIL;

	PHullResult hr;

	unsigned int vcount = desc.mVcount;
	if (vcount < 8) vcount = 8;

	cbtAlignedObjectArray<cbtVector3> vertexSource;
	vertexSource.resize(static_cast<int>(vcount));

	cbtVector3 scale;

	unsigned int ovcount;

	bool ok = CleanupVertices(desc.mVcount, desc.mVertices, desc.mVertexStride, ovcount, &vertexSource[0], desc.mNormalEpsilon, scale);  // normalize point cloud, remove duplicates!

	if (ok)
	{
		//		if ( 1 ) // scale vertices back to their original size.
		{
			for (unsigned int i = 0; i < ovcount; i++)
			{
				cbtVector3 &v = vertexSource[static_cast<int>(i)];
				v[0] *= scale[0];
				v[1] *= scale[1];
				v[2] *= scale[2];
			}
		}

		ok = ComputeHull(ovcount, &vertexSource[0], hr, desc.mMaxVertices);

		if (ok)
		{
			// re-index triangle mesh so it refers to only used vertices, rebuild a new vertex table.
			cbtAlignedObjectArray<cbtVector3> vertexScratch;
			vertexScratch.resize(static_cast<int>(hr.mVcount));

			BringOutYourDead(hr.mVertices, hr.mVcount, &vertexScratch[0], ovcount, &hr.m_Indices[0], hr.mIndexCount);

			ret = QE_OK;

			if (desc.HasHullFlag(QF_TRIANGLES))  // if he wants the results as triangle!
			{
				result.mPolygons = false;
				result.mNumOutputVertices = ovcount;
				result.m_OutputVertices.resize(static_cast<int>(ovcount));
				result.mNumFaces = hr.mFaceCount;
				result.mNumIndices = hr.mIndexCount;

				result.m_Indices.resize(static_cast<int>(hr.mIndexCount));

				memcpy(&result.m_OutputVertices[0], &vertexScratch[0], sizeof(cbtVector3) * ovcount);

				if (desc.HasHullFlag(QF_REVERSE_ORDER))
				{
					const unsigned int *source = &hr.m_Indices[0];
					unsigned int *dest = &result.m_Indices[0];

					for (unsigned int i = 0; i < hr.mFaceCount; i++)
					{
						dest[0] = source[2];
						dest[1] = source[1];
						dest[2] = source[0];
						dest += 3;
						source += 3;
					}
				}
				else
				{
					memcpy(&result.m_Indices[0], &hr.m_Indices[0], sizeof(unsigned int) * hr.mIndexCount);
				}
			}
			else
			{
				result.mPolygons = true;
				result.mNumOutputVertices = ovcount;
				result.m_OutputVertices.resize(static_cast<int>(ovcount));
				result.mNumFaces = hr.mFaceCount;
				result.mNumIndices = hr.mIndexCount + hr.mFaceCount;
				result.m_Indices.resize(static_cast<int>(result.mNumIndices));
				memcpy(&result.m_OutputVertices[0], &vertexScratch[0], sizeof(cbtVector3) * ovcount);

				//				if ( 1 )
				{
					const unsigned int *source = &hr.m_Indices[0];
					unsigned int *dest = &result.m_Indices[0];
					for (unsigned int i = 0; i < hr.mFaceCount; i++)
					{
						dest[0] = 3;
						if (desc.HasHullFlag(QF_REVERSE_ORDER))
						{
							dest[1] = source[2];
							dest[2] = source[1];
							dest[3] = source[0];
						}
						else
						{
							dest[1] = source[0];
							dest[2] = source[1];
							dest[3] = source[2];
						}

						dest += 4;
						source += 3;
					}
				}
			}
			ReleaseHull(hr);
		}
	}

	return ret;
}